

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbox.cpp
# Opt level: O0

void * rw::xbox::createTexture(int32 width,int32 height,int32 numlevels,uint32 format)

{
  uint32 uVar1;
  int32 *piVar2;
  int local_3c;
  int32 i_1;
  RasterLevels *levels;
  uint8 *data;
  int32 i;
  int32 size;
  int32 h;
  int32 w;
  uint32 format_local;
  int32 numlevels_local;
  int32 height_local;
  int32 width_local;
  
  data._4_4_ = 0;
  i = height;
  size = width;
  for (data._0_4_ = 0; (int)data < numlevels; data._0_4_ = (int)data + 1) {
    uVar1 = calculateTextureSize(size,i,1,format);
    data._4_4_ = uVar1 + data._4_4_;
    size = size / 2;
    if (size == 0) {
      size = 1;
    }
    i = i / 2;
    if (i == 0) {
      i = 1;
    }
  }
  piVar2 = (int32 *)mustmalloc_LOC((long)(numlevels + -1) * 0x18 + 0x20 +
                                   (long)(int)(data._4_4_ + 3U & 0xfffffffc),0x30b00,
                                   "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/d3d/xbox.cpp line: 504"
                                  );
  levels = (RasterLevels *)(piVar2 + (long)(numlevels + -1) * 6 + 8);
  *piVar2 = numlevels;
  piVar2[1] = format;
  i = height;
  size = width;
  for (local_3c = 0; local_3c < numlevels; local_3c = local_3c + 1) {
    piVar2[(long)local_3c * 6 + 2] = size;
    piVar2[(long)local_3c * 6 + 3] = i;
    *(RasterLevels **)(piVar2 + (long)local_3c * 6 + 6) = levels;
    uVar1 = calculateTextureSize(size,i,1,format);
    piVar2[(long)local_3c * 6 + 4] = uVar1;
    levels = (RasterLevels *)((long)levels->levels + (long)piVar2[(long)local_3c * 6 + 4] + -8);
    size = size / 2;
    if (size == 0) {
      size = 1;
    }
    i = i / 2;
    if (i == 0) {
      i = 1;
    }
  }
  return piVar2;
}

Assistant:

static void*
createTexture(int32 width, int32 height, int32 numlevels, uint32 format)
{
	int32 w = width;
	int32 h = height;
	int32 size = 0;
	for(int32 i = 0; i < numlevels; i++){
		size += calculateTextureSize(w, h, 1, format);
		w /= 2;
		if(w == 0) w = 1;
		h /= 2;
		if(h == 0) h = 1;
	}
	size = (size+3)&~3;
	uint8 *data = (uint8*)rwNew(sizeof(RasterLevels)+sizeof(RasterLevels::Level)*(numlevels-1)+size,
		MEMDUR_EVENT | ID_DRIVER);
	RasterLevels *levels = (RasterLevels*)data;
	data += sizeof(RasterLevels)+sizeof(RasterLevels::Level)*(numlevels-1);
	levels->numlevels = numlevels;
	levels->format = format;
	w = width;
	h = height;
	for(int32 i = 0; i < numlevels; i++){
		levels->levels[i].width = w;
		levels->levels[i].height = h;
		levels->levels[i].data = data;
		levels->levels[i].size = calculateTextureSize(w, h, 1, format);
		data += levels->levels[i].size;
		w /= 2;
		if(w == 0) w = 1;
		h /= 2;
		if(h == 0) h = 1;
	}
	return levels;
}